

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  dynbuf *s;
  undefined1 *puVar1;
  size_t *psVar2;
  uint8_t uVar3;
  int32_t stream_id;
  Curl_easy *pCVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  CURLcode CVar8;
  CURLUcode CVar9;
  CURLMcode CVar10;
  Curl_easy *pCVar11;
  size_t sVar12;
  char *pcVar13;
  HTTP *pHVar14;
  CURLU *u;
  char *pcVar15;
  ulong uVar16;
  bool bVar17;
  curl_pushheaders heads;
  Curl_easy *local_60;
  curl_pushheaders local_58;
  HTTP *local_48;
  nghttp2_session *local_40;
  char *local_38;
  
  stream_id = (frame->hd).stream_id;
  if (stream_id == 0) {
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    pCVar11 = *(Curl_easy **)((long)userp + 0x4a0);
    iVar5 = *(int *)((long)userp + 0x4e8);
    uVar7 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
    *(uint32_t *)((long)userp + 0x4e8) = uVar7;
    uVar7 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
    *(bool *)((long)userp + 0x4ec) = uVar7 != 0;
    if (iVar5 != *(int *)((long)userp + 0x4e8)) {
      Curl_infof(pCVar11,"Connection state changed (MAX_CONCURRENT_STREAMS == %u)!");
      pCVar11->multi->recheckstate = true;
      return 0;
    }
    return 0;
  }
  pCVar11 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (pCVar11 == (Curl_easy *)0x0) {
    return 0;
  }
  pHVar14 = (pCVar11->req).p.http;
  if (pHVar14 == (HTTP *)0x0) {
    return -0x386;
  }
  uVar3 = (frame->hd).type;
  local_40 = session;
  if (uVar3 != '\x05') {
    if (uVar3 == '\x01') {
      if (pHVar14->bodystarted != false) {
        return 0;
      }
      if (pHVar14->status_code == -1) {
        return -0x386;
      }
      if (99 < pHVar14->status_code - 100U) {
        pHVar14->bodystarted = true;
        pHVar14->status_code = -1;
      }
      s = &pHVar14->header_recvbuf;
      CVar8 = Curl_dyn_addn(s,"\r\n",2);
      if (CVar8 != CURLE_OK) {
        return -0x386;
      }
      sVar12 = Curl_dyn_len(s);
      uVar16 = sVar12 - pHVar14->nread_header_recvbuf;
      pcVar15 = pHVar14->mem;
      if (pHVar14->len < uVar16) {
        uVar16 = pHVar14->len;
      }
      sVar12 = pHVar14->memlen;
      pcVar13 = Curl_dyn_ptr(s);
      memcpy(pcVar15 + sVar12,pcVar13 + pHVar14->nread_header_recvbuf,uVar16);
      pHVar14->nread_header_recvbuf = pHVar14->nread_header_recvbuf + uVar16;
      pHVar14->len = pHVar14->len - uVar16;
      pHVar14->memlen = pHVar14->memlen + uVar16;
      psVar2 = &(pCVar11->state).drain;
      *psVar2 = *psVar2 + 1;
      *(long *)((long)userp + 0x4e0) = *(long *)((long)userp + 0x4e0) + 1;
      if (*(Curl_easy **)((long)userp + 0x4a0) == pCVar11) {
        return 0;
      }
      Curl_expire(pCVar11,0,EXPIRE_RUN_NOW);
      return 0;
    }
    if (uVar3 != '\0') {
      return 0;
    }
    if (pHVar14->bodystarted != false) {
      return 0;
    }
    iVar5 = nghttp2_submit_rst_stream(session,'\0',stream_id,1);
    iVar6 = nghttp2_is_fatal(iVar5);
    goto LAB_0050f880;
  }
  if (pCVar11->multi->push_cb == (curl_push_callback)0x0) {
LAB_0050f856:
    iVar5 = 1;
  }
  else {
    local_58.data = curl_easy_duphandle(pCVar11);
    if (local_58.data != (CURL_conflict *)0x0) {
      pHVar14 = (HTTP *)(*Curl_ccalloc)(1,0x2e8);
      if (pHVar14 == (HTTP *)0x0) {
        Curl_close(&local_58.data);
      }
      else {
        ((local_58.data)->req).p.http = pHVar14;
        Curl_dyn_init(&pHVar14->header_recvbuf,0x20000);
        pHVar14 = ((local_58.data)->req).p.http;
        pHVar14->bodystarted = false;
        pHVar14->status_code = -1;
        pHVar14->closed = false;
        pHVar14->error = 0;
        pHVar14->pausedata = (uint8_t *)0x0;
        pHVar14->pauselen = 0;
        pHVar14->close_handled = false;
        pHVar14->mem = (char *)0x0;
        pHVar14->len = 0;
        pHVar14->memlen = 0;
        ((local_58.data)->state).stream_weight = (pCVar11->state).stream_weight;
      }
    }
    pCVar4 = local_58.data;
    local_60 = local_58.data;
    if (local_58.data == (Curl_easy *)0x0) {
      Curl_infof(pCVar11,"failed to duplicate handle");
      goto LAB_0050f856;
    }
    pHVar14 = (pCVar11->req).p.http;
    local_58.data = pCVar11;
    local_58.frame = (nghttp2_push_promise *)frame;
    if (pHVar14 == (HTTP *)0x0) {
      Curl_failf(pCVar11,"Internal NULL stream");
LAB_0050f851:
      Curl_close(&local_60);
      goto LAB_0050f856;
    }
    local_38 = (char *)0x0;
    local_48 = pHVar14;
    u = curl_url();
    if (u == (CURLU *)0x0) {
      iVar5 = 5;
    }
    else {
      pcVar15 = curl_pushheader_byname(&local_58,":scheme");
      if (pcVar15 == (char *)0x0) {
LAB_0050f72a:
        pcVar15 = curl_pushheader_byname(&local_58,":authority");
        if ((pcVar15 == (char *)0x0) ||
           (CVar9 = curl_url_set(u,CURLUPART_HOST,pcVar15,0), CVar9 == CURLUE_OK)) {
          pcVar15 = curl_pushheader_byname(&local_58,":path");
          if ((pcVar15 == (char *)0x0) ||
             (CVar9 = curl_url_set(u,CURLUPART_PATH,pcVar15,0), CVar9 == CURLUE_OK)) {
            CVar9 = curl_url_get(u,CURLUPART_URL,&local_38,0);
            bVar17 = CVar9 == CURLUE_OK;
            iVar5 = (uint)!bVar17 << 2;
          }
          else {
            bVar17 = false;
            iVar5 = 3;
          }
        }
        else {
          bVar17 = false;
          iVar5 = 2;
        }
      }
      else {
        iVar5 = 1;
        bVar17 = false;
        CVar9 = curl_url_set(u,CURLUPART_SCHEME,pcVar15,0);
        if (CVar9 == CURLUE_OK) goto LAB_0050f72a;
      }
      curl_url_cleanup(u);
      if (bVar17) {
        if (((pCVar4->state).field_0x6d2 & 2) != 0) {
          (*Curl_cfree)((pCVar4->state).url);
        }
        puVar1 = &(pCVar4->state).field_0x6d2;
        *puVar1 = *puVar1 | 2;
        (pCVar4->state).url = local_38;
        iVar5 = 0;
      }
    }
    if (iVar5 != 0) goto LAB_0050f851;
    Curl_set_in_callback(pCVar11,true);
    pHVar14 = local_48;
    iVar5 = (*pCVar11->multi->push_cb)
                      (pCVar11,local_60,local_48->push_headers_used,&local_58,
                       pCVar11->multi->push_userp);
    Curl_set_in_callback(pCVar11,false);
    if (pHVar14->push_headers_used != 0) {
      uVar16 = 0;
      do {
        (*Curl_cfree)(pHVar14->push_headers[uVar16]);
        uVar16 = uVar16 + 1;
        pHVar14 = local_48;
      } while (uVar16 < local_48->push_headers_used);
    }
    (*Curl_cfree)(pHVar14->push_headers);
    pHVar14->push_headers = (char **)0x0;
    pHVar14->push_headers_used = 0;
    pHVar14 = (local_60->req).p.http;
    if (iVar5 == 0) {
      pHVar14->stream_id = (frame->push_promise).promised_stream_id;
      *(undefined4 *)&(local_60->req).size = 0xffffffff;
      *(undefined4 *)((long)&(local_60->req).size + 4) = 0xffffffff;
      *(undefined4 *)&(local_60->req).maxdownload = 0xffffffff;
      *(undefined4 *)((long)&(local_60->req).maxdownload + 4) = 0xffffffff;
      CVar10 = Curl_multi_add_perform(pCVar11->multi,local_60,(connectdata *)userp);
      if (CVar10 != CURLM_OK) {
        Curl_infof(pCVar11,"failed to add handle to multi");
        http2_stream_free((local_60->req).p.http);
        (local_60->req).p.file = (FILEPROTO *)0x0;
        goto LAB_0050f851;
      }
      iVar5 = nghttp2_session_set_stream_user_data
                        (*(nghttp2_session **)((long)userp + 0x4a8),
                         (frame->push_promise).promised_stream_id,local_60);
      if (iVar5 != 0) {
        Curl_infof(pCVar11,"failed to set user_data for stream %u",
                   (ulong)(uint)(frame->push_promise).promised_stream_id);
        goto LAB_0050f856;
      }
      Curl_dyn_init(&pHVar14->header_recvbuf,0x20000);
      Curl_dyn_init(&pHVar14->trailer_recvbuf,0x20000);
      iVar5 = 0;
    }
    else {
      http2_stream_free(pHVar14);
      (local_60->req).p.file = (FILEPROTO *)0x0;
      Curl_close(&local_60);
    }
  }
  if (iVar5 == 0) {
    return 0;
  }
  iVar6 = nghttp2_submit_rst_stream(local_40,'\0',(frame->push_promise).promised_stream_id,8);
  iVar6 = nghttp2_is_fatal(iVar6);
  if (iVar5 == 2) {
    return -0x386;
  }
LAB_0050f880:
  if (iVar6 == 0) {
    return 0;
  }
  return -0x386;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  struct Curl_easy *data_s = NULL;
  struct HTTP *stream = NULL;
  struct Curl_easy *data = get_transfer(httpc);
  int rv;
  size_t left, ncopy;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    if(frame->hd.type == NGHTTP2_SETTINGS) {
      uint32_t max_conn = httpc->settings.max_concurrent_streams;
      H2BUGF(infof(data, "Got SETTINGS"));
      httpc->settings.max_concurrent_streams =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
      httpc->settings.enable_push =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_ENABLE_PUSH);
      H2BUGF(infof(data, "MAX_CONCURRENT_STREAMS == %d",
                   httpc->settings.max_concurrent_streams));
      H2BUGF(infof(data, "ENABLE_PUSH == %s",
                   httpc->settings.enable_push?"TRUE":"false"));
      if(max_conn != httpc->settings.max_concurrent_streams) {
        /* only signal change if the value actually changed */
        infof(data,
              "Connection state changed (MAX_CONCURRENT_STREAMS == %u)!",
              httpc->settings.max_concurrent_streams);
        multi_connchanged(data->multi);
      }
    }
    return 0;
  }
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    H2BUGF(infof(data,
                 "No Curl_easy associated with stream: %u",
                 stream_id));
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream) {
    H2BUGF(infof(data_s, "No proto pointer for stream: %u",
                 stream_id));
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  H2BUGF(infof(data_s, "on_frame_recv() header %x stream %u",
               frame->hd.type, stream_id));

  switch(frame->hd.type) {
  case NGHTTP2_DATA:
    /* If body started on this stream, then receiving DATA is illegal. */
    if(!stream->bodystarted) {
      rv = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     stream_id, NGHTTP2_PROTOCOL_ERROR);

      if(nghttp2_is_fatal(rv)) {
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  case NGHTTP2_HEADERS:
    if(stream->bodystarted) {
      /* Only valid HEADERS after body started is trailer HEADERS.  We
         buffer them in on_header callback. */
      break;
    }

    /* nghttp2 guarantees that :status is received, and we store it to
       stream->status_code. Fuzzing has proven this can still be reached
       without status code having been set. */
    if(stream->status_code == -1)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    /* Only final status code signals the end of header */
    if(stream->status_code / 100 != 1) {
      stream->bodystarted = TRUE;
      stream->status_code = -1;
    }

    result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST("\r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    left = Curl_dyn_len(&stream->header_recvbuf) -
      stream->nread_header_recvbuf;
    ncopy = CURLMIN(stream->len, left);

    memcpy(&stream->mem[stream->memlen],
           Curl_dyn_ptr(&stream->header_recvbuf) +
           stream->nread_header_recvbuf,
           ncopy);
    stream->nread_header_recvbuf += ncopy;

    DEBUGASSERT(stream->mem);
    H2BUGF(infof(data_s, "Store %zu bytes headers from stream %u at %p",
                 ncopy, stream_id, stream->mem));

    stream->len -= ncopy;
    stream->memlen += ncopy;

    drain_this(data_s, httpc);
    /* if we receive data for another handle, wake that up */
    if(get_transfer(httpc) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);
    break;
  case NGHTTP2_PUSH_PROMISE:
    rv = push_promise(data_s, conn, &frame->push_promise);
    if(rv) { /* deny! */
      int h2;
      DEBUGASSERT((rv > CURL_PUSH_OK) && (rv <= CURL_PUSH_ERROROUT));
      h2 = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     frame->push_promise.promised_stream_id,
                                     NGHTTP2_CANCEL);
      if(nghttp2_is_fatal(h2))
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      else if(rv == CURL_PUSH_ERROROUT) {
        DEBUGF(infof(data_s, "Fail the parent stream (too)"));
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  default:
    H2BUGF(infof(data_s, "Got frame type %x for stream %u",
                 frame->hd.type, stream_id));
    break;
  }
  return 0;
}